

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int yaml_parser_parse_document_start(yaml_parser_t *parser,yaml_event_t *event,int implicit)

{
  yaml_parser_state_t **ppyVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  int iVar8;
  yaml_token_type_t yVar9;
  yaml_parser_state_t *pyVar10;
  yaml_token_t *pyVar11;
  yaml_tag_directive_t *local_a8;
  yaml_tag_directive_t *apyStack_a0 [2];
  yaml_version_directive_t *local_90;
  yaml_mark_t end_mark;
  yaml_mark_t start_mark;
  
  local_90 = (yaml_version_directive_t *)0x0;
  local_a8 = (yaml_tag_directive_t *)0x0;
  apyStack_a0[0] = (yaml_tag_directive_t *)0x0;
  if ((parser->token_available == 0) && (iVar8 = yaml_parser_fetch_more_tokens(parser), iVar8 == 0))
  {
LAB_0010a581:
    iVar8 = 0;
  }
  else {
    pyVar11 = (parser->tokens).head;
    if (pyVar11 == (yaml_token_t *)0x0) {
      return 0;
    }
    if (implicit == 0) {
      while (yVar9 = pyVar11->type, yVar9 == YAML_DOCUMENT_END_TOKEN) {
        parser->token_available = 0;
        parser->tokens_parsed = parser->tokens_parsed + 1;
        parser->stream_end_produced = 0;
        (parser->tokens).head = pyVar11 + 1;
        iVar8 = yaml_parser_fetch_more_tokens(parser);
        if (iVar8 == 0) {
          return 0;
        }
        pyVar11 = (parser->tokens).head;
        if (pyVar11 == (yaml_token_t *)0x0) {
          return 0;
        }
      }
LAB_0010a34a:
      if (yVar9 != YAML_STREAM_END_TOKEN) {
        sVar4 = (pyVar11->start_mark).index;
        sVar5 = (pyVar11->start_mark).line;
        sVar2 = (pyVar11->start_mark).column;
        iVar8 = yaml_parser_process_directives(parser,&local_90,&local_a8,apyStack_a0);
        if (iVar8 == 0) goto LAB_0010a581;
        if (((parser->token_available != 0) ||
            (iVar8 = yaml_parser_fetch_more_tokens(parser), iVar8 != 0)) &&
           (pyVar11 = (parser->tokens).head, pyVar11 != (yaml_token_t *)0x0)) {
          if (pyVar11->type == YAML_DOCUMENT_START_TOKEN) {
            pyVar10 = (parser->states).top;
            if (pyVar10 == (parser->states).end) {
              ppyVar1 = &(parser->states).top;
              iVar8 = yaml_stack_extend(&(parser->states).start,ppyVar1,&(parser->states).end);
              if (iVar8 == 0) {
                parser->error = YAML_MEMORY_ERROR;
                goto LAB_0010a53d;
              }
              pyVar10 = *ppyVar1;
            }
            (parser->states).top = pyVar10 + 1;
            *pyVar10 = YAML_PARSE_DOCUMENT_END_STATE;
            parser->state = YAML_PARSE_DOCUMENT_CONTENT_STATE;
            sVar3 = (pyVar11->end_mark).column;
            sVar6 = (pyVar11->end_mark).index;
            sVar7 = (pyVar11->end_mark).line;
            *(undefined8 *)event = 0;
            (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
            (event->data).scalar.length = 0;
            *(undefined8 *)((long)&event->data + 0x20) = 0;
            (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
            (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
            *(undefined8 *)((long)&event->data + 0x28) = 0;
            event->type = YAML_DOCUMENT_START_EVENT;
            (event->start_mark).column = sVar2;
            (event->start_mark).index = sVar4;
            (event->start_mark).line = sVar5;
            (event->end_mark).index = sVar6;
            (event->end_mark).line = sVar7;
            (event->end_mark).column = sVar3;
            (event->data).document_start.version_directive = local_90;
            (event->data).document_start.tag_directives.start = local_a8;
            (event->data).document_start.tag_directives.end = apyStack_a0[0];
            goto LAB_0010a3ad;
          }
          sVar2 = (pyVar11->start_mark).column;
          sVar4 = (pyVar11->start_mark).index;
          sVar5 = (pyVar11->start_mark).line;
          parser->error = YAML_PARSER_ERROR;
          parser->problem = "did not find expected <document start>";
          (parser->problem_mark).index = sVar4;
          (parser->problem_mark).line = sVar5;
          (parser->problem_mark).column = sVar2;
        }
LAB_0010a53d:
        yaml_free(local_90);
        for (; local_a8 != apyStack_a0[0]; apyStack_a0[0] = apyStack_a0[0] + -1) {
          yaml_free(apyStack_a0[0][-1].handle);
          yaml_free(apyStack_a0[0][-1].prefix);
        }
        yaml_free(local_a8);
        goto LAB_0010a581;
      }
      parser->state = YAML_PARSE_END_STATE;
      *(undefined8 *)event = 0;
      (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
      (event->end_mark).index = 0;
      (event->end_mark).line = 0;
      (event->start_mark).line = 0;
      (event->start_mark).column = 0;
      *(undefined8 *)((long)&event->data + 0x28) = 0;
      (event->start_mark).index = 0;
      (event->data).scalar.length = 0;
      *(undefined8 *)((long)&event->data + 0x20) = 0;
      (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
      (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
      (event->end_mark).column = 0;
      event->type = YAML_STREAM_END_EVENT;
      (event->start_mark).column = (pyVar11->start_mark).column;
      sVar2 = (pyVar11->start_mark).line;
      (event->start_mark).index = (pyVar11->start_mark).index;
      (event->start_mark).line = sVar2;
      (event->end_mark).column = (pyVar11->end_mark).column;
      sVar2 = (pyVar11->end_mark).line;
      (event->end_mark).index = (pyVar11->end_mark).index;
      (event->end_mark).line = sVar2;
LAB_0010a3ad:
      parser->token_available = 0;
      parser->tokens_parsed = parser->tokens_parsed + 1;
      pyVar11 = (parser->tokens).head;
      parser->stream_end_produced = (uint)(pyVar11->type == YAML_STREAM_END_TOKEN);
      (parser->tokens).head = pyVar11 + 1;
    }
    else {
      yVar9 = pyVar11->type;
      if (yVar9 - YAML_STREAM_END_TOKEN < 4) goto LAB_0010a34a;
      iVar8 = yaml_parser_process_directives
                        (parser,(yaml_version_directive_t **)0x0,(yaml_tag_directive_t **)0x0,
                         (yaml_tag_directive_t **)0x0);
      if (iVar8 == 0) {
        return 0;
      }
      pyVar10 = (parser->states).top;
      if (pyVar10 == (parser->states).end) {
        ppyVar1 = &(parser->states).top;
        iVar8 = yaml_stack_extend(&(parser->states).start,ppyVar1,&(parser->states).end);
        if (iVar8 == 0) {
          parser->error = YAML_MEMORY_ERROR;
          return 0;
        }
        pyVar10 = *ppyVar1;
      }
      (parser->states).top = pyVar10 + 1;
      *pyVar10 = YAML_PARSE_DOCUMENT_END_STATE;
      parser->state = YAML_PARSE_BLOCK_NODE_STATE;
      *(undefined8 *)event = 0;
      (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
      (event->end_mark).index = 0;
      (event->end_mark).line = 0;
      (event->start_mark).line = 0;
      (event->start_mark).column = 0;
      *(undefined8 *)((long)&event->data + 0x28) = 0;
      (event->start_mark).index = 0;
      (event->data).scalar.length = 0;
      *(undefined8 *)((long)&event->data + 0x20) = 0;
      (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
      (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
      (event->end_mark).column = 0;
      event->type = YAML_DOCUMENT_START_EVENT;
      sVar2 = (pyVar11->start_mark).line;
      (event->start_mark).index = (pyVar11->start_mark).index;
      (event->start_mark).line = sVar2;
      (event->start_mark).column = (pyVar11->start_mark).column;
      sVar2 = (pyVar11->start_mark).line;
      (event->end_mark).index = (pyVar11->start_mark).index;
      (event->end_mark).line = sVar2;
      (event->end_mark).column = (pyVar11->start_mark).column;
      (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
      (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
      (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
      (event->data).document_start.implicit = 1;
    }
    iVar8 = 1;
  }
  return iVar8;
}

Assistant:

static int
yaml_parser_parse_document_start(yaml_parser_t *parser, yaml_event_t *event,
        int implicit)
{
    yaml_token_t *token;
    yaml_version_directive_t *version_directive = NULL;
    struct {
        yaml_tag_directive_t *start;
        yaml_tag_directive_t *end;
    } tag_directives = { NULL, NULL };

    token = PEEK_TOKEN(parser);
    if (!token) return 0;

    /* Parse extra document end indicators. */

    if (!implicit)
    {
        while (token->type == YAML_DOCUMENT_END_TOKEN) {
            SKIP_TOKEN(parser);
            token = PEEK_TOKEN(parser);
            if (!token) return 0;
        }
    }

    /* Parse an implicit document. */

    if (implicit && token->type != YAML_VERSION_DIRECTIVE_TOKEN &&
            token->type != YAML_TAG_DIRECTIVE_TOKEN &&
            token->type != YAML_DOCUMENT_START_TOKEN &&
            token->type != YAML_STREAM_END_TOKEN)
    {
        if (!yaml_parser_process_directives(parser, NULL, NULL, NULL))
            return 0;
        if (!PUSH(parser, parser->states, YAML_PARSE_DOCUMENT_END_STATE))
            return 0;
        parser->state = YAML_PARSE_BLOCK_NODE_STATE;
        DOCUMENT_START_EVENT_INIT(*event, NULL, NULL, NULL, 1,
                token->start_mark, token->start_mark);
        return 1;
    }

    /* Parse an explicit document. */

    else if (token->type != YAML_STREAM_END_TOKEN)
    {
        yaml_mark_t start_mark, end_mark;
        start_mark = token->start_mark;
        if (!yaml_parser_process_directives(parser, &version_directive,
                    &tag_directives.start, &tag_directives.end))
            return 0;
        token = PEEK_TOKEN(parser);
        if (!token) goto error;
        if (token->type != YAML_DOCUMENT_START_TOKEN) {
            yaml_parser_set_parser_error(parser,
                    "did not find expected <document start>", token->start_mark);
            goto error;
        }
        if (!PUSH(parser, parser->states, YAML_PARSE_DOCUMENT_END_STATE))
            goto error;
        parser->state = YAML_PARSE_DOCUMENT_CONTENT_STATE;
        end_mark = token->end_mark;
        DOCUMENT_START_EVENT_INIT(*event, version_directive,
                tag_directives.start, tag_directives.end, 0,
                start_mark, end_mark);
        SKIP_TOKEN(parser);
        version_directive = NULL;
        tag_directives.start = tag_directives.end = NULL;
        return 1;
    }

    /* Parse the stream end. */

    else
    {
        parser->state = YAML_PARSE_END_STATE;
        STREAM_END_EVENT_INIT(*event, token->start_mark, token->end_mark);
        SKIP_TOKEN(parser);
        return 1;
    }

error:
    yaml_free(version_directive);
    while (tag_directives.start != tag_directives.end) {
        yaml_free(tag_directives.end[-1].handle);
        yaml_free(tag_directives.end[-1].prefix);
        tag_directives.end --;
    }
    yaml_free(tag_directives.start);
    return 0;
}